

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<float,_3,_3> *
tcu::rotationMatrixX(Matrix<float,_3,_3> *__return_storage_ptr__,float radiansX)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float s;
  float local_1c;
  float c;
  float local_14;
  Matrix<float,_3,_3> *pMStack_10;
  float radiansX_local;
  Matrix<float,_3,_3> *mat;
  
  c._3_1_ = 0;
  local_1c = 1.0;
  local_14 = radiansX;
  pMStack_10 = __return_storage_ptr__;
  Matrix<float,_3,_3>::Matrix(__return_storage_ptr__,&local_1c);
  fVar2 = deFloatCos(local_14);
  fVar3 = deFloatSin(local_14);
  pfVar1 = Matrix<float,_3,_3>::operator()(__return_storage_ptr__,1,1);
  *pfVar1 = fVar2;
  pfVar1 = Matrix<float,_3,_3>::operator()(__return_storage_ptr__,1,2);
  *pfVar1 = -fVar3;
  pfVar1 = Matrix<float,_3,_3>::operator()(__return_storage_ptr__,2,1);
  *pfVar1 = fVar3;
  pfVar1 = Matrix<float,_3,_3>::operator()(__return_storage_ptr__,2,2);
  *pfVar1 = fVar2;
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<float, 3, 3> rotationMatrixX (float radiansX)
{
	Matrix<float, 3, 3> mat(1.0f);
	float				c	= deFloatCos(radiansX);
	float				s	= deFloatSin(radiansX);

	mat(1, 1) = c;
	mat(1, 2) = -s;
	mat(2, 1) = s;
	mat(2, 2) = c;

	return mat;
}